

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

ReservedRange *
google::protobuf::descriptor_unittest::AddReservedRange(DescriptorProto *parent,int start,int end)

{
  ReservedRange *pRVar1;
  
  pRVar1 = (ReservedRange *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(parent->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto_ReservedRange>);
  (pRVar1->field_0)._impl_.start_ = start;
  (pRVar1->field_0)._impl_.end_ = end;
  *(byte *)&pRVar1->field_0 = *(byte *)&pRVar1->field_0 | 3;
  return pRVar1;
}

Assistant:

DescriptorProto::ReservedRange* AddReservedRange(DescriptorProto* parent,
                                                 int start, int end) {
  DescriptorProto::ReservedRange* result = parent->add_reserved_range();
  result->set_start(start);
  result->set_end(end);
  return result;
}